

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  mz_zip_internal_state *pmVar5;
  mz_bool mVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  short *psVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  mz_uint8 *pCentral_dir_header;
  ulong uVar15;
  uint uVar16;
  mz_zip_error mVar17;
  bool bVar18;
  bool bVar19;
  mz_uint32 uncomp_crc32;
  mz_uint8 descriptor_buf [32];
  mz_bool found_zip64_ext_data_in_cdir;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  uint local_514;
  short *local_510;
  uint local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  ulong auStack_4ec [3];
  ulong local_4d0;
  ulong local_4c8;
  mz_bool local_4bc;
  int local_4b8;
  byte local_4b2;
  uint local_4aa;
  uint local_4a6;
  uint local_4a2;
  ushort local_49e;
  ushort local_49c;
  mz_uint64 local_498;
  ulong local_490;
  long local_488;
  mz_zip_archive_file_stat local_480;
  
  local_4bc = 0;
  local_4fc = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar5 = pZip->m_pState;
  if ((((pmVar5 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
LAB_018704bb:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_018704bb;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar5->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar6 = mz_zip_file_stat_internal(pZip,file_index,pCentral_dir_header,&local_480,&local_4bc);
  if (mVar6 == 0) {
    return 0;
  }
  if (local_480.m_is_directory != 0) {
    return 1;
  }
  if (local_480.m_uncomp_size == 0) {
    return 1;
  }
  if (local_480.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((local_480.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (local_480.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_480.m_local_header_ofs,&local_4b8,0x1e);
  if (sVar8 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_4b8 != 0x4034b50) {
LAB_018705ea:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar9 = (ulong)local_49e;
  local_514 = (uint)local_49c;
  local_4d0 = (ulong)local_4a6;
  local_4c8 = (ulong)local_4a2;
  sVar10 = strlen(local_480.m_filename);
  if (sVar10 != uVar9) goto LAB_018705ea;
  local_498 = local_480.m_local_header_ofs + uVar9 + 0x1e;
  local_490 = (ulong)local_514;
  local_488 = local_498 + local_490;
  if (pZip->m_archive_size < local_480.m_comp_size + local_488) goto LAB_018705ea;
  uVar16 = local_514;
  if (local_514 < local_49e) {
    uVar16 = (uint)local_49e;
  }
  if (uVar16 == 0) {
    local_510 = (short *)0x0;
    bVar18 = false;
  }
  else {
    local_510 = (short *)(*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(void *)0x0,1,(size_t)uVar16);
    bVar18 = local_510 == (short *)0x0;
  }
  if (bVar18) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  if (uVar9 == 0) {
LAB_018706b7:
    uVar9 = local_490;
    bVar18 = false;
    if ((local_514 != 0) && (((int)local_4d0 == -1 || ((int)local_4c8 == -1)))) {
      sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_498,local_510,local_490);
      if (sVar8 == uVar9) {
        bVar18 = false;
        psVar11 = local_510;
        do {
          if (local_514 < 4) {
LAB_01870727:
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            iVar13 = 1;
          }
          else {
            uVar16 = (ushort)psVar11[1] + 4;
            if (local_514 < uVar16) goto LAB_01870727;
            if (*psVar11 == 1) {
              if ((ushort)psVar11[1] < 0x10) {
                pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                iVar13 = 2;
              }
              else {
                local_4c8 = *(ulong *)(psVar11 + 2);
                local_4d0 = *(ulong *)(psVar11 + 6);
                bVar18 = true;
                iVar13 = 3;
              }
            }
            else {
              psVar11 = (short *)((long)psVar11 + (ulong)uVar16);
              iVar13 = 0;
              local_514 = local_514 - uVar16;
            }
          }
          iVar7 = 0;
          if (iVar13 != 0) {
            if (iVar13 != 3) {
              iVar7 = iVar13;
            }
            break;
          }
        } while (local_514 != 0);
      }
      else {
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        bVar18 = false;
        iVar7 = 2;
      }
      if (iVar7 == 2) goto LAB_01870a10;
      if (iVar7 != 0) {
        return 0;
      }
    }
    if ((((local_4b2 & 8) != 0) && (local_4d0 == 0)) && (local_4aa == 0)) {
      sVar8 = (ulong)(pmVar5->m_zip64 != 0 || bVar18) * 8 + 0x10;
      sVar12 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488 + local_480.m_comp_size,&local_4f8,
                                sVar8);
      mVar17 = MZ_ZIP_FILE_READ_FAILED;
      if (sVar12 == sVar8) {
        bVar19 = local_4f8 == 0x8074b50;
        uVar16 = local_4f8 & 0xff;
        if (bVar19) {
          uVar16 = local_4f4;
        }
        bVar1 = local_4f4._1_1_;
        if (!bVar19) {
          bVar1 = local_4f8._1_1_;
        }
        bVar2 = local_4f4._2_1_;
        if (!bVar19) {
          bVar2 = local_4f8._2_1_;
        }
        bVar3 = local_4f4._3_1_;
        if (!bVar19) {
          bVar3 = local_4f8._3_1_;
        }
        uVar9 = (ulong)bVar19;
        if (bVar19) {
          local_4f4 = local_4f0;
        }
        uVar14 = (ulong)((uint)*(byte *)((long)&local_4f4 + uVar9 * 4 + 3) << 0x18 |
                        (uint)*(byte *)((long)&local_4f4 + uVar9 * 4 + 2) << 0x10 |
                        (uint)*(byte *)((long)&local_4f4 + uVar9 * 4 + 1) << 8 | local_4f4 & 0xff);
        uVar15 = (ulong)*(byte *)((long)auStack_4ec + uVar9 * 4 + -4);
        bVar4 = *(byte *)((long)auStack_4ec + uVar9 * 4 + -3);
        if (bVar18 || pmVar5->m_zip64 != 0) {
          uVar9 = (ulong)(local_4f8 == 0x8074b50);
          uVar14 = uVar14 | uVar15 << 0x20 | (ulong)bVar4 << 0x28 |
                            (ulong)*(byte *)((long)auStack_4ec + uVar9 * 4 + -2) << 0x30 |
                            (ulong)*(byte *)((long)auStack_4ec + uVar9 * 4 + -1) << 0x38;
          uVar15 = *(ulong *)((long)auStack_4ec + uVar9 * 4);
        }
        else {
          uVar15 = ((uint)*(byte *)((long)auStack_4ec + (ulong)(local_4f8 == 0x8074b50) * 4 + -1) <<
                    0x18 | (uint)*(byte *)((long)auStack_4ec +
                                          (ulong)(local_4f8 == 0x8074b50) * 4 + -2) << 0x10 |
                           (uint)bVar4 << 8) | uVar15;
        }
        mVar17 = MZ_ZIP_VALIDATION_FAILED;
        if (((((uint)bVar3 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar1 << 8 | uVar16 & 0xff) ==
              local_480.m_crc32) && (uVar14 == local_480.m_comp_size)) &&
           (uVar15 == local_480.m_uncomp_size)) goto LAB_018709ab;
      }
      pZip->m_last_error = mVar17;
      goto LAB_01870a10;
    }
    if (((local_4aa == local_480.m_crc32) && (local_4d0 == local_480.m_comp_size)) &&
       (local_4c8 == local_480.m_uncomp_size)) {
LAB_018709ab:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_510);
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar6 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,mz_zip_compute_crc32_callback,&local_4fc,0);
      if (mVar6 != 0) {
        if (local_4fc != local_480.m_crc32) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
          return 0;
        }
        return 1;
      }
      return 0;
    }
  }
  else {
    sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_480.m_local_header_ofs + 0x1e,local_510,uVar9)
    ;
    if (sVar8 != uVar9) {
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_01870a10;
    }
    iVar7 = bcmp(local_480.m_filename,local_510,uVar9);
    if (iVar7 == 0) goto LAB_018706b7;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_01870a10:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_510);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;
    mz_zip_internal_state *pState;
    const mz_uint8 *pCentral_dir_header;
    mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint64 local_header_ofs = 0;
    mz_uint32 local_header_filename_len, local_header_extra_len, local_header_crc32;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
    mz_bool has_data_descriptor;
    mz_uint32 local_header_bit_flags;

    mz_zip_array file_data_array;
    mz_zip_array_init(&file_data_array, 1);

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (file_index > pZip->m_total_files)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

    if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header, &file_stat, &found_zip64_ext_data_in_cdir))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_is_encrypted)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports stored and deflate. */
    if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    if (!file_stat.m_is_supported)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    /* Read and parse the local directory entry. */
    local_header_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    local_header_filename_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
    local_header_bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    has_data_descriptor = (local_header_bit_flags & 8) != 0;

    if (local_header_filename_len != strlen(file_stat.m_filename))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (!mz_zip_array_resize(pZip, &file_data_array, MZ_MAX(local_header_filename_len, local_header_extra_len), MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (local_header_filename_len)
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE, file_data_array.m_p, local_header_filename_len) != local_header_filename_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        /* I've seen 1 archive that had the same pathname, but used backslashes in the local dir and forward slashes in the central dir. Do we care about this? For now, this case will fail validation. */
        if (memcmp(file_stat.m_filename, file_data_array.m_p, local_header_filename_len) != 0)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_uint32 extra_size_remaining = local_header_extra_len;
        const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                    goto handle_failure;
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    /* TODO: parse local header extra data when local_header_comp_size is 0xFFFFFFFF! (big_descriptor.zip) */
    /* I've seen zips in the wild with the data descriptor bit set, but proper local header values and bogus data descriptors */
    if ((has_data_descriptor) && (!local_header_comp_size) && (!local_header_crc32))
    {
        mz_uint8 descriptor_buf[32];
        mz_bool has_id;
        const mz_uint8 *pSrc;
        mz_uint32 file_crc32;
        mz_uint64 comp_size = 0, uncomp_size = 0;

        mz_uint32 num_descriptor_uint32s = ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size, descriptor_buf, sizeof(mz_uint32) * num_descriptor_uint32s) != (sizeof(mz_uint32) * num_descriptor_uint32s))
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
        pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

        file_crc32 = MZ_READ_LE32(pSrc);

        if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
        }
        else
        {
            comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
        }

        if ((file_crc32 != file_stat.m_crc32) || (comp_size != file_stat.m_comp_size) || (uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }
    else
    {
        if ((local_header_crc32 != file_stat.m_crc32) || (local_header_comp_size != file_stat.m_comp_size) || (local_header_uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    mz_zip_array_clear(pZip, &file_data_array);

    if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0)
    {
        if (!mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
            return MZ_FALSE;

        /* 1 more check to be sure, although the extract checks too. */
        if (uncomp_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            return MZ_FALSE;
        }
    }

    return MZ_TRUE;

handle_failure:
    mz_zip_array_clear(pZip, &file_data_array);
    return MZ_FALSE;
}